

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateInit2(zng_stream *strm,int32_t level,int32_t method,int32_t windowBits,
                        int32_t memLevel,int32_t strategy)

{
  long *plVar1;
  zng_stream *strm_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  deflate_allocs *alloc_bufs;
  int lit_bufsize;
  int wrap;
  deflate_state *s;
  zng_stream *in_stack_ffffffffffffffb8;
  int local_34;
  int local_1c;
  int local_14;
  int32_t local_4;
  
  local_34 = 1;
  (*functable.force_init)();
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else {
    *(undefined8 *)(in_RDI + 0x30) = 0;
    if (*(long *)(in_RDI + 0x40) == 0) {
      *(code **)(in_RDI + 0x40) = zng_zcalloc;
      *(undefined8 *)(in_RDI + 0x50) = 0;
    }
    if (*(long *)(in_RDI + 0x48) == 0) {
      *(code **)(in_RDI + 0x48) = zng_zcfree;
    }
    local_14 = in_ESI;
    if (in_ESI == -1) {
      local_14 = 6;
    }
    if (in_ECX < 0) {
      local_34 = 0;
      if (in_ECX < -0xf) {
        return -2;
      }
      local_1c = -in_ECX;
    }
    else {
      local_1c = in_ECX;
      if (0xf < in_ECX) {
        local_34 = 2;
        local_1c = in_ECX + -0x10;
      }
    }
    if ((((((in_R8D < 1) || (9 < in_R8D)) || (in_EDX != 8)) ||
         (((local_1c < 8 || (0xf < local_1c)) ||
          ((local_14 < 0 || ((9 < local_14 || (in_R9D < 0)))))))) || (4 < in_R9D)) ||
       ((local_1c == 8 && (local_34 != 1)))) {
      local_4 = -2;
    }
    else {
      if (local_1c == 8) {
        local_1c = 9;
      }
      strm_00 = (zng_stream *)alloc_deflate((zng_stream *)alloc_bufs,unaff_retaddr_00,unaff_retaddr)
      ;
      if (strm_00 == (zng_stream *)0x0) {
        local_4 = -4;
      }
      else {
        plVar1 = (long *)strm_00->total_in;
        plVar1[0x2ee] = (long)strm_00;
        plVar1[0xb] = (long)strm_00->next_out;
        plVar1[0xc] = strm_00->total_out;
        plVar1[0xd] = (long)strm_00->msg;
        plVar1[1] = *(long *)&strm_00->avail_out;
        *(long **)(in_RDI + 0x38) = plVar1;
        *plVar1 = in_RDI;
        *(undefined4 *)(plVar1 + 6) = 1;
        *(int *)(plVar1 + 4) = local_34;
        plVar1[5] = 0;
        *(int *)((long)plVar1 + 0x44) = local_1c;
        *(int *)(plVar1 + 8) = 1 << ((byte)*(undefined4 *)((long)plVar1 + 0x44) & 0x1f);
        *(int *)(plVar1 + 9) = (int)plVar1[8] + -1;
        *(undefined4 *)(plVar1 + 10) = 0;
        *(int *)((long)plVar1 + 0x172c) = 1 << ((char)in_R8D + 6U & 0x1f);
        *(int *)(plVar1 + 3) = *(int *)((long)plVar1 + 0x172c) << 2;
        if ((((plVar1[0xb] == 0) || (plVar1[0xc] == 0)) || (plVar1[0xd] == 0)) || (plVar1[1] == 0))
        {
          *(undefined4 *)(plVar1 + 6) = 3;
          *(char **)(in_RDI + 0x30) = "insufficient memory";
          zng_deflateEnd(in_stack_ffffffffffffffb8);
          local_4 = -4;
        }
        else {
          plVar1[0x2e6] = plVar1[1] + (ulong)(uint)(*(int *)((long)plVar1 + 0x172c) << 1);
          plVar1[0x2e7] = plVar1[1] + (ulong)(uint)(*(int *)((long)plVar1 + 0x172c) << 2);
          *(int *)((long)plVar1 + 0x1744) = *(int *)((long)plVar1 + 0x172c) + -1;
          *(int *)(plVar1 + 0x16) = local_14;
          *(int *)((long)plVar1 + 0xb4) = in_R9D;
          *(undefined4 *)((long)plVar1 + 0x3c) = 0;
          *(undefined4 *)(plVar1 + 7) = 0;
          local_4 = zng_deflateReset(strm_00);
        }
      }
    }
  }
  return local_4;
}

Assistant:

PREFIX(deflateInit2)(PREFIX3(stream) *strm, int32_t level, int32_t method, int32_t windowBits,
                                            int32_t memLevel, int32_t strategy) {
    /* Todo: ignore strm->next_in if we use it as window */
    deflate_state *s;
    int wrap = 1;

    /* Initialize functable */
    FUNCTABLE_INIT;

    if (strm == NULL)
        return Z_STREAM_ERROR;

    strm->msg = NULL;
    if (strm->zalloc == NULL) {
        strm->zalloc = PREFIX(zcalloc);
        strm->opaque = NULL;
    }
    if (strm->zfree == NULL)
        strm->zfree = PREFIX(zcfree);

    if (level == Z_DEFAULT_COMPRESSION)
        level = 6;

    if (windowBits < 0) { /* suppress zlib wrapper */
        wrap = 0;
        if (windowBits < -MAX_WBITS)
            return Z_STREAM_ERROR;
        windowBits = -windowBits;
#ifdef GZIP
    } else if (windowBits > MAX_WBITS) {
        wrap = 2;       /* write gzip wrapper instead */
        windowBits -= 16;
#endif
    }
    if (memLevel < 1 || memLevel > MAX_MEM_LEVEL || method != Z_DEFLATED || windowBits < MIN_WBITS ||
        windowBits > MAX_WBITS || level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED ||
        (windowBits == 8 && wrap != 1)) {
        return Z_STREAM_ERROR;
    }
    if (windowBits == 8)
        windowBits = 9;  /* until 256-byte window bug fixed */

    /* Allocate buffers */
    int lit_bufsize = 1 << (memLevel + 6);
    deflate_allocs *alloc_bufs = alloc_deflate(strm, windowBits, lit_bufsize);
    if (alloc_bufs == NULL)
        return Z_MEM_ERROR;

    s = alloc_bufs->state;
    s->alloc_bufs = alloc_bufs;
    s->window = alloc_bufs->window;
    s->prev = alloc_bufs->prev;
    s->head = alloc_bufs->head;
    s->pending_buf = alloc_bufs->pending_buf;

    strm->state = (struct internal_state *)s;
    s->strm = strm;
    s->status = INIT_STATE;     /* to pass state test in deflateReset() */

    s->wrap = wrap;
    s->gzhead = NULL;
    s->w_bits = (unsigned int)windowBits;
    s->w_size = 1 << s->w_bits;
    s->w_mask = s->w_size - 1;

    s->high_water = 0;      /* nothing written to s->window yet */

    s->lit_bufsize = lit_bufsize; /* 16K elements by default */

    /* We overlay pending_buf and sym_buf. This works since the average size
     * for length/distance pairs over any compressed block is assured to be 31
     * bits or less.
     *
     * Analysis: The longest fixed codes are a length code of 8 bits plus 5
     * extra bits, for lengths 131 to 257. The longest fixed distance codes are
     * 5 bits plus 13 extra bits, for distances 16385 to 32768. The longest
     * possible fixed-codes length/distance pair is then 31 bits total.
     *
     * sym_buf starts one-fourth of the way into pending_buf. So there are
     * three bytes in sym_buf for every four bytes in pending_buf. Each symbol
     * in sym_buf is three bytes -- two for the distance and one for the
     * literal/length. As each symbol is consumed, the pointer to the next
     * sym_buf value to read moves forward three bytes. From that symbol, up to
     * 31 bits are written to pending_buf. The closest the written pending_buf
     * bits gets to the next sym_buf symbol to read is just before the last
     * code is written. At that time, 31*(n-2) bits have been written, just
     * after 24*(n-2) bits have been consumed from sym_buf. sym_buf starts at
     * 8*n bits into pending_buf. (Note that the symbol buffer fills when n-1
     * symbols are written.) The closest the writing gets to what is unread is
     * then n+14 bits. Here n is lit_bufsize, which is 16384 by default, and
     * can range from 128 to 32768.
     *
     * Therefore, at a minimum, there are 142 bits of space between what is
     * written and what is read in the overlain buffers, so the symbols cannot
     * be overwritten by the compressed data. That space is actually 139 bits,
     * due to the three-bit fixed-code block header.
     *
     * That covers the case where either Z_FIXED is specified, forcing fixed
     * codes, or when the use of fixed codes is chosen, because that choice
     * results in a smaller compressed block than dynamic codes. That latter
     * condition then assures that the above analysis also covers all dynamic
     * blocks. A dynamic-code block will only be chosen to be emitted if it has
     * fewer bits than a fixed-code block would for the same set of symbols.
     * Therefore its average symbol length is assured to be less than 31. So
     * the compressed data for a dynamic block also cannot overwrite the
     * symbols from which it is being constructed.
     */

    s->pending_buf_size = s->lit_bufsize * 4;

    if (s->window == NULL || s->prev == NULL || s->head == NULL || s->pending_buf == NULL) {
        s->status = FINISH_STATE;
        strm->msg = ERR_MSG(Z_MEM_ERROR);
        PREFIX(deflateEnd)(strm);
        return Z_MEM_ERROR;
    }

#ifdef LIT_MEM
    s->d_buf = (uint16_t *)(s->pending_buf + (s->lit_bufsize << 1));
    s->l_buf = s->pending_buf + (s->lit_bufsize << 2);
    s->sym_end = s->lit_bufsize - 1;
#else
    s->sym_buf = s->pending_buf + s->lit_bufsize;
    s->sym_end = (s->lit_bufsize - 1) * 3;
#endif
    /* We avoid equality with lit_bufsize*3 because of wraparound at 64K
     * on 16 bit machines and because stored blocks are restricted to
     * 64K-1 bytes.
     */

    s->level = level;
    s->strategy = strategy;
    s->block_open = 0;
    s->reproducible = 0;

    return PREFIX(deflateReset)(strm);
}